

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O1

void embree::sse42::InstanceIntersector1::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,InstancePrimitive *prim)

{
  Vec3ff *pVVar1;
  Instance *pIVar2;
  RTCRayQueryContext *pRVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float *pfVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar29;
  undefined1 auVar30 [16];
  RayQueryContext newcontext;
  
  pIVar2 = prim->instance;
  if ((((ray->super_RayK<1>).mask & (pIVar2->super_Geometry).mask) != 0) &&
     (pRVar3 = context->user, pRVar3->instID[0] == 0xffffffff)) {
    pRVar3->instID[0] = prim->instID_;
    pRVar3->instPrimID[0] = 0;
    fVar5 = (pIVar2->world2local0).l.vx.field_0.m128[0];
    fVar6 = (pIVar2->world2local0).l.vx.field_0.m128[1];
    fVar7 = (pIVar2->world2local0).l.vx.field_0.m128[2];
    fVar8 = (pIVar2->world2local0).l.vx.field_0.m128[3];
    fVar9 = (pIVar2->world2local0).l.vy.field_0.m128[0];
    fVar10 = (pIVar2->world2local0).l.vy.field_0.m128[1];
    fVar11 = (pIVar2->world2local0).l.vy.field_0.m128[2];
    fVar12 = (pIVar2->world2local0).l.vy.field_0.m128[3];
    fVar13 = (pIVar2->world2local0).l.vz.field_0.m128[0];
    fVar14 = (pIVar2->world2local0).l.vz.field_0.m128[1];
    fVar15 = (pIVar2->world2local0).l.vz.field_0.m128[2];
    fVar16 = (pIVar2->world2local0).l.vz.field_0.m128[3];
    fVar17 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar18 = (ray->super_RayK<1>).org.field_0.m128[1];
    uVar24 = *(undefined8 *)&(ray->super_RayK<1>).org.field_0;
    pfVar20 = (ray->super_RayK<1>).org.field_0.m128 + 2;
    fVar19 = *pfVar20;
    uVar25 = *(undefined8 *)pfVar20;
    pVVar1 = &(ray->super_RayK<1>).dir;
    fVar21 = (pVVar1->field_0).m128[0];
    fVar22 = (ray->super_RayK<1>).dir.field_0.m128[1];
    uVar26 = *(undefined8 *)&pVVar1->field_0;
    pfVar20 = (ray->super_RayK<1>).dir.field_0.m128 + 2;
    fVar23 = *pfVar20;
    uVar27 = *(undefined8 *)pfVar20;
    auVar28._0_4_ =
         fVar17 * fVar5 +
         fVar18 * fVar9 + fVar19 * fVar13 + (pIVar2->world2local0).p.field_0.m128[0];
    auVar28._4_4_ =
         fVar17 * fVar6 +
         fVar18 * fVar10 + fVar19 * fVar14 + (pIVar2->world2local0).p.field_0.m128[1];
    auVar28._8_4_ =
         fVar17 * fVar7 +
         fVar18 * fVar11 + fVar19 * fVar15 + (pIVar2->world2local0).p.field_0.m128[2];
    auVar28._12_4_ =
         fVar17 * fVar8 +
         fVar18 * fVar12 + fVar19 * fVar16 + (pIVar2->world2local0).p.field_0.m128[3];
    aVar29 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar28,(ray->super_RayK<1>).org.field_0.m128[3],0x30);
    (ray->super_RayK<1>).org.field_0 = aVar29;
    auVar30._0_4_ = fVar21 * fVar5 + fVar22 * fVar9 + fVar23 * fVar13;
    auVar30._4_4_ = fVar21 * fVar6 + fVar22 * fVar10 + fVar23 * fVar14;
    auVar30._8_4_ = fVar21 * fVar7 + fVar22 * fVar11 + fVar23 * fVar15;
    auVar30._12_4_ = fVar21 * fVar8 + fVar22 * fVar12 + fVar23 * fVar16;
    aVar29 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar30,(ray->super_RayK<1>).dir.field_0.m128[3],0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar29;
    lVar4 = *(long *)&(pIVar2->super_Geometry).field_0x58;
    (**(code **)(lVar4 + 0x78))(lVar4 + 0x58,ray);
    *(undefined8 *)&(ray->super_RayK<1>).org.field_0 = uVar24;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uVar25;
    *(undefined8 *)&(ray->super_RayK<1>).dir.field_0 = uVar26;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uVar27;
    pRVar3->instID[0] = 0xffffffff;
    pRVar3->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersector1::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      const Instance* instance = prim.instance;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local();
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }